

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::ListSortFun::GetFunctions(void)

{
  scalar_function_t *psVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  long lVar2;
  bind_scalar_function_t *pp_Var3;
  undefined8 *puVar4;
  ScalarFunctionSet *in_RDI;
  bind_scalar_function_t *pp_Var5;
  scalar_function_t *__x;
  byte bVar6;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  ScalarFunctionSet *list_sort;
  ScalarFunction sort_orders;
  ScalarFunction sort_order;
  ScalarFunction sort;
  undefined4 in_stack_fffffffffffff6f4;
  undefined4 in_stack_fffffffffffff6fc;
  FunctionNullHandling in_stack_fffffffffffff708;
  allocator_type local_8f1;
  LogicalType local_8e8;
  vector<duckdb::ScalarFunction,_true> *local_8d0;
  _func_int **local_8c8;
  scalar_function_t local_8c0;
  scalar_function_t local_8a0;
  scalar_function_t local_880;
  _Any_data *local_860;
  LogicalType local_858 [4];
  LogicalType local_7f8;
  vector<duckdb::LogicalType,_true> local_7e0;
  LogicalType local_7c8;
  vector<duckdb::LogicalType,_true> local_7b0;
  LogicalType local_798;
  vector<duckdb::LogicalType,_true> local_780;
  LogicalType local_768;
  LogicalType local_750;
  LogicalType local_738;
  undefined1 local_720 [144];
  LogicalType LStack_690;
  FunctionStability local_678;
  FunctionNullHandling FStack_677;
  FunctionErrors FStack_676;
  FunctionCollationHandling FStack_675;
  _Any_data _Stack_670;
  _Manager_type local_660;
  undefined8 auStack_650 [9];
  element_type *local_608;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_600;
  ScalarFunction local_5f8;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  bVar6 = 0;
  LogicalType::LogicalType((LogicalType *)local_720,ANY);
  LogicalType::LIST((LogicalType *)&local_280,(LogicalType *)local_720);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_280;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_780,__l,
             (allocator_type *)&local_8e8);
  LogicalType::LogicalType(local_858,ANY);
  LogicalType::LIST(&local_798,local_858);
  local_880.super__Function_base._M_functor._8_8_ = 0;
  local_880.super__Function_base._M_functor._M_unused._M_object = ListSortFunction;
  local_880._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_880.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_738,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_738;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff6f4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff6fc;
  ScalarFunction::ScalarFunction
            (&local_158,&local_780,&local_798,&local_880,ListNormalSortBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_fffffffffffff708,(bind_lambda_function_t)in_RDI);
  LogicalType::~LogicalType(&local_738);
  if (local_880.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_880.super__Function_base._M_manager)
              ((_Any_data *)&local_880,(_Any_data *)&local_880,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_798);
  LogicalType::~LogicalType(local_858);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_780);
  LogicalType::~LogicalType((LogicalType *)&local_280);
  LogicalType::~LogicalType((LogicalType *)local_720);
  LogicalType::LogicalType(local_858,ANY);
  LogicalType::LIST((LogicalType *)local_720,local_858);
  LogicalType::LogicalType((LogicalType *)(local_720 + 0x18),VARCHAR);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_720;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_7b0,__l_00,
             (allocator_type *)(local_858 + 3));
  LogicalType::LogicalType(&local_8e8,ANY);
  LogicalType::LIST(&local_7c8,&local_8e8);
  local_8a0.super__Function_base._M_functor._8_8_ = 0;
  local_8a0.super__Function_base._M_functor._M_unused._M_object = ListSortFunction;
  local_8a0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_8a0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_750,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_750;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff6f4;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff6fc;
  ScalarFunction::ScalarFunction
            (&local_280,&local_7b0,&local_7c8,&local_8a0,ListNormalSortBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_00,CONSISTENT,in_stack_fffffffffffff708,(bind_lambda_function_t)in_RDI);
  LogicalType::~LogicalType(&local_750);
  if (local_8a0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_8a0.super__Function_base._M_manager)
              ((_Any_data *)&local_8a0,(_Any_data *)&local_8a0,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_7c8);
  LogicalType::~LogicalType(&local_8e8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_7b0);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(local_720 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::~LogicalType(local_858);
  LogicalType::LogicalType(&local_8e8,ANY);
  LogicalType::LIST(local_858,&local_8e8);
  LogicalType::LogicalType(local_858 + 1,VARCHAR);
  LogicalType::LogicalType(local_858 + 2,VARCHAR);
  __l_01._M_len = 3;
  __l_01._M_array = local_858;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_7e0,__l_01,
             &local_8f1);
  LogicalType::LogicalType(local_858 + 3,ANY);
  LogicalType::LIST(&local_7f8,local_858 + 3);
  local_8c0.super__Function_base._M_functor._8_8_ = 0;
  local_8c0.super__Function_base._M_functor._M_unused._M_object = ListSortFunction;
  local_8c0._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_8c0.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_768,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_01._0_8_ = &local_768;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff6f4;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff6fc;
  ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_720,&local_7e0,&local_7f8,&local_8c0,ListNormalSortBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs_01,CONSISTENT,in_stack_fffffffffffff708,(bind_lambda_function_t)in_RDI);
  LogicalType::~LogicalType(&local_768);
  if (local_8c0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_8c0.super__Function_base._M_manager)
              ((_Any_data *)&local_8c0,(_Any_data *)&local_8c0,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_7f8);
  LogicalType::~LogicalType(local_858 + 3);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_7e0);
  lVar2 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_858[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::~LogicalType(&local_8e8);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_3a8,(SimpleFunction *)&local_158);
  local_8c8 = (_func_int **)&PTR__BaseScalarFunction_02446ee0;
  local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02446ee0;
  LogicalType::LogicalType
            (&local_3a8.super_BaseScalarFunction.return_type,
             &local_158.super_BaseScalarFunction.return_type);
  local_3a8.super_BaseScalarFunction.stability = local_158.super_BaseScalarFunction.stability;
  local_3a8.super_BaseScalarFunction.null_handling =
       local_158.super_BaseScalarFunction.null_handling;
  local_3a8.super_BaseScalarFunction.errors = local_158.super_BaseScalarFunction.errors;
  local_3a8.super_BaseScalarFunction.collation_handling =
       local_158.super_BaseScalarFunction.collation_handling;
  local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0243add0;
  psVar1 = &local_3a8.function;
  local_860 = (_Any_data *)&local_158.function;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (psVar1,(function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)local_860);
  pp_Var3 = &local_158.bind;
  pp_Var5 = &local_3a8.bind;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pp_Var5 = *pp_Var3;
    pp_Var3 = pp_Var3 + (ulong)bVar6 * -2 + 1;
    pp_Var5 = pp_Var5 + (ulong)bVar6 * -2 + 1;
  }
  local_3a8.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_158.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_3a8.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_158.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_158.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_158.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_158.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_158.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_8d0 = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&local_8d0->
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3a8);
  local_3a8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0243add0;
  if (local_3a8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3a8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3a8.function.super__Function_base._M_manager)
              ((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_3a8.super_BaseScalarFunction);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_4d0,(SimpleFunction *)&local_280);
  local_4d0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function = local_8c8;
  LogicalType::LogicalType
            (&local_4d0.super_BaseScalarFunction.return_type,
             &local_280.super_BaseScalarFunction.return_type);
  local_4d0.super_BaseScalarFunction.stability = local_280.super_BaseScalarFunction.stability;
  local_4d0.super_BaseScalarFunction.null_handling =
       local_280.super_BaseScalarFunction.null_handling;
  local_4d0.super_BaseScalarFunction.errors = local_280.super_BaseScalarFunction.errors;
  local_4d0.super_BaseScalarFunction.collation_handling =
       local_280.super_BaseScalarFunction.collation_handling;
  local_4d0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0243add0;
  psVar1 = &local_4d0.function;
  __x = &local_280.function;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (psVar1,__x);
  pp_Var3 = &local_280.bind;
  pp_Var5 = &local_4d0.bind;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pp_Var5 = *pp_Var3;
    pp_Var3 = pp_Var3 + (ulong)bVar6 * -2 + 1;
    pp_Var5 = pp_Var5 + (ulong)bVar6 * -2 + 1;
  }
  local_4d0.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_280.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_4d0.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_280.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_280.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_280.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_280.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_280.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&local_8d0->
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_4d0);
  local_4d0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0243add0;
  if (local_4d0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4d0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_4d0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4d0.function.super__Function_base._M_manager)
              ((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_4d0.super_BaseScalarFunction);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_5f8,(SimpleFunction *)local_720);
  local_5f8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function = local_8c8;
  LogicalType::LogicalType(&local_5f8.super_BaseScalarFunction.return_type,&LStack_690);
  local_5f8.super_BaseScalarFunction.stability = local_678;
  local_5f8.super_BaseScalarFunction.null_handling = FStack_677;
  local_5f8.super_BaseScalarFunction.errors = FStack_676;
  local_5f8.super_BaseScalarFunction.collation_handling = FStack_675;
  local_5f8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0243add0;
  psVar1 = &local_5f8.function;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (psVar1,(function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)&_Stack_670);
  puVar4 = auStack_650;
  pp_Var3 = &local_5f8.bind;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pp_Var3 = (bind_scalar_function_t)*puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    pp_Var3 = pp_Var3 + (ulong)bVar6 * -2 + 1;
  }
  local_5f8.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_608;
  local_5f8.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_600._M_pi;
  if (local_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_600._M_pi)->_M_use_count = (local_600._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_600._M_pi)->_M_use_count = (local_600._M_pi)->_M_use_count + 1;
    }
  }
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&local_8d0->
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_5f8);
  local_5f8.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0243add0;
  if (local_5f8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5f8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5f8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_5f8.function.super__Function_base._M_manager)
              ((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_5f8.super_BaseScalarFunction);
  local_720._0_8_ = &PTR__ScalarFunction_0243add0;
  if (local_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_600._M_pi);
  }
  if (local_660 != (_Manager_type)0x0) {
    (*local_660)(&_Stack_670,&_Stack_670,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_720);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0243add0;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0243add0;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)(local_860,local_860,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  return in_RDI;
}

Assistant:

ScalarFunctionSet ListSortFun::GetFunctions() {
	// one parameter: list
	ScalarFunction sort({LogicalType::LIST(LogicalType::ANY)}, LogicalType::LIST(LogicalType::ANY), ListSortFunction,
	                    ListNormalSortBind);

	// two parameters: list, order
	ScalarFunction sort_order({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR},
	                          LogicalType::LIST(LogicalType::ANY), ListSortFunction, ListNormalSortBind);

	// three parameters: list, order, null order
	ScalarFunction sort_orders({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR, LogicalType::VARCHAR},
	                           LogicalType::LIST(LogicalType::ANY), ListSortFunction, ListNormalSortBind);

	ScalarFunctionSet list_sort;
	list_sort.AddFunction(sort);
	list_sort.AddFunction(sort_order);
	list_sort.AddFunction(sort_orders);
	return list_sort;
}